

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

string * test_sprintf<unsigned_int,int>(string_view format,uint *args,int *args_1)

{
  string *in_RDI;
  uint *in_stack_00000030;
  basic_string_view<char> *in_stack_00000038;
  
  fmt::v5::sprintf<fmt::v5::basic_string_view<char>,unsigned_int,int>
            (in_stack_00000038,in_stack_00000030,(int *)format.size_);
  return in_RDI;
}

Assistant:

std::string test_sprintf(fmt::string_view format, const Args &... args) {
  return fmt::sprintf(format, args...);
}